

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<ParamsStream<AutoFile&,TransactionSerParams>,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *s,int *args,uint256 *args_1,
               uint256 *args_2,uint *args_3,uint *args_4,uint *args_5)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<ParamsStream<AutoFile&,TransactionSerParams>>(s,*args);
  base_blob<256u>::Serialize<ParamsStream<AutoFile&,TransactionSerParams>>
            ((base_blob<256u> *)args_1,s);
  base_blob<256u>::Serialize<ParamsStream<AutoFile&,TransactionSerParams>>
            ((base_blob<256u> *)args_2,s);
  ser_writedata32<ParamsStream<AutoFile&,TransactionSerParams>>(s,*args_3);
  ser_writedata32<ParamsStream<AutoFile&,TransactionSerParams>>(s,*args_4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32<ParamsStream<AutoFile&,TransactionSerParams>>(s,*args_5);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}